

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  long lVar2;
  RTCIntersectArguments *pRVar3;
  float fVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  bool bVar14;
  undefined1 auVar15 [16];
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  undefined4 uVar22;
  ulong unaff_R12;
  size_t mask;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar38;
  float fVar39;
  undefined1 auVar31 [16];
  float fVar40;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar54;
  float fVar55;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar56;
  float fVar62;
  float fVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar65;
  undefined1 auVar59 [16];
  float fVar64;
  float fVar66;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar93;
  undefined1 auVar85 [16];
  float fVar84;
  float fVar90;
  float fVar92;
  float fVar94;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar89;
  float fVar91;
  undefined1 auVar88 [32];
  float fVar95;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [16];
  float fVar103;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar111 [16];
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar122 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  int local_156c;
  undefined1 local_1568 [16];
  undefined1 local_1558 [16];
  undefined1 local_1548 [16];
  undefined8 local_1538;
  float fStack_1530;
  float fStack_152c;
  ulong local_1528;
  ulong local_1520;
  ulong local_1518;
  NodeRef *local_1510;
  ulong local_1508;
  ulong local_1500;
  undefined1 local_14f8 [16];
  ulong local_14e8;
  ulong local_14e0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 uStack_11e0;
  undefined4 uStack_11dc;
  NodeRef stack [564];
  
  auVar15 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar30 = ray->tfar;
    if (0.0 <= fVar30) {
      local_1510 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar1 = (ray->dir).field_0;
      auVar82 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx((undefined1  [16])aVar1,auVar57);
      auVar81._8_4_ = 0x219392ef;
      auVar81._0_8_ = 0x219392ef219392ef;
      auVar81._12_4_ = 0x219392ef;
      auVar57 = vcmpps_avx(auVar57,auVar81,1);
      auVar67._8_4_ = 0x3f800000;
      auVar67._0_8_ = &DAT_3f8000003f800000;
      auVar67._12_4_ = 0x3f800000;
      auVar81 = vdivps_avx(auVar67,(undefined1  [16])aVar1);
      auVar68._8_4_ = 0x5d5e0b6b;
      auVar68._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar68._12_4_ = 0x5d5e0b6b;
      auVar57 = vblendvps_avx(auVar81,auVar68,auVar57);
      auVar58._0_4_ = auVar57._0_4_ * 0.99999964;
      auVar58._4_4_ = auVar57._4_4_ * 0.99999964;
      auVar58._8_4_ = auVar57._8_4_ * 0.99999964;
      auVar58._12_4_ = auVar57._12_4_ * 0.99999964;
      uVar22 = *(undefined4 *)&(ray->org).field_0;
      auVar88._4_4_ = uVar22;
      auVar88._0_4_ = uVar22;
      auVar88._8_4_ = uVar22;
      auVar88._12_4_ = uVar22;
      auVar88._16_4_ = uVar22;
      auVar88._20_4_ = uVar22;
      auVar88._24_4_ = uVar22;
      auVar88._28_4_ = uVar22;
      local_11f8 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uStack_11f4 = local_11f8;
      uStack_11f0 = local_11f8;
      uStack_11ec = local_11f8;
      uStack_11e8 = local_11f8;
      uStack_11e4 = local_11f8;
      uStack_11e0 = local_11f8;
      uStack_11dc = local_11f8;
      local_1218 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      uStack_1214 = local_1218;
      uStack_1210 = local_1218;
      uStack_120c = local_1218;
      uStack_1208 = local_1218;
      uStack_1204 = local_1218;
      uStack_1200 = local_1218;
      uStack_11fc = local_1218;
      auVar69._0_4_ = auVar57._0_4_ * 1.0000004;
      auVar69._4_4_ = auVar57._4_4_ * 1.0000004;
      auVar69._8_4_ = auVar57._8_4_ * 1.0000004;
      auVar69._12_4_ = auVar57._12_4_ * 1.0000004;
      auVar57 = vshufps_avx(auVar58,auVar58,0);
      register0x000012d0 = auVar57;
      _local_1238 = auVar57;
      auVar57 = vmovshdup_avx(auVar58);
      auVar81 = vshufps_avx(auVar58,auVar58,0x55);
      register0x000012d0 = auVar81;
      _local_1258 = auVar81;
      auVar81 = vshufpd_avx(auVar58,auVar58,1);
      auVar67 = vshufps_avx(auVar58,auVar58,0xaa);
      register0x00001310 = auVar67;
      _local_1278 = auVar67;
      auVar67 = vshufps_avx(auVar69,auVar69,0);
      register0x00001310 = auVar67;
      _local_1298 = auVar67;
      local_1518 = (ulong)(auVar58._0_4_ < 0.0) << 5;
      auVar67 = vshufps_avx(auVar69,auVar69,0x55);
      register0x00001310 = auVar67;
      _local_12b8 = auVar67;
      auVar67 = vshufps_avx(auVar69,auVar69,0xaa);
      register0x00001310 = auVar67;
      _local_12d8 = auVar67;
      local_1520 = (ulong)(auVar57._0_4_ < 0.0) << 5 | 0x40;
      local_1528 = (ulong)(auVar81._0_4_ < 0.0) << 5 | 0x80;
      uVar23 = local_1518 ^ 0x20;
      local_1508 = local_1520 ^ 0x20;
      local_14e0 = local_1528 ^ 0x20;
      auVar57 = vshufps_avx(auVar82,auVar82,0);
      local_12f8._16_16_ = auVar57;
      local_12f8._0_16_ = auVar57;
      auVar57 = vshufps_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),0);
      local_1318._16_16_ = auVar57;
      local_1318._0_16_ = auVar57;
      uVar24 = local_1508;
      local_1500 = uVar23;
      do {
        if (local_1510 == stack) {
          return;
        }
        uVar19 = local_1510[-1].ptr;
        local_1510 = local_1510 + -1;
        do {
          if ((uVar19 & 8) == 0) {
            auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + local_1518),auVar88);
            auVar6._4_4_ = auVar5._4_4_ * (float)local_1238._4_4_;
            auVar6._0_4_ = auVar5._0_4_ * (float)local_1238._0_4_;
            auVar6._8_4_ = auVar5._8_4_ * fStack_1230;
            auVar6._12_4_ = auVar5._12_4_ * fStack_122c;
            auVar6._16_4_ = auVar5._16_4_ * fStack_1228;
            auVar6._20_4_ = auVar5._20_4_ * fStack_1224;
            auVar6._24_4_ = auVar5._24_4_ * fStack_1220;
            auVar6._28_4_ = auVar5._28_4_;
            auVar13._4_4_ = uStack_11f4;
            auVar13._0_4_ = local_11f8;
            auVar13._8_4_ = uStack_11f0;
            auVar13._12_4_ = uStack_11ec;
            auVar13._16_4_ = uStack_11e8;
            auVar13._20_4_ = uStack_11e4;
            auVar13._24_4_ = uStack_11e0;
            auVar13._28_4_ = uStack_11dc;
            auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + local_1520),auVar13);
            auVar7._4_4_ = auVar5._4_4_ * (float)local_1258._4_4_;
            auVar7._0_4_ = auVar5._0_4_ * (float)local_1258._0_4_;
            auVar7._8_4_ = auVar5._8_4_ * fStack_1250;
            auVar7._12_4_ = auVar5._12_4_ * fStack_124c;
            auVar7._16_4_ = auVar5._16_4_ * fStack_1248;
            auVar7._20_4_ = auVar5._20_4_ * fStack_1244;
            auVar7._24_4_ = auVar5._24_4_ * fStack_1240;
            auVar7._28_4_ = auVar5._28_4_;
            auVar5 = vmaxps_avx(auVar6,auVar7);
            auVar12._4_4_ = uStack_1214;
            auVar12._0_4_ = local_1218;
            auVar12._8_4_ = uStack_1210;
            auVar12._12_4_ = uStack_120c;
            auVar12._16_4_ = uStack_1208;
            auVar12._20_4_ = uStack_1204;
            auVar12._24_4_ = uStack_1200;
            auVar12._28_4_ = uStack_11fc;
            auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + local_1528),auVar12);
            auVar8._4_4_ = auVar6._4_4_ * (float)local_1278._4_4_;
            auVar8._0_4_ = auVar6._0_4_ * (float)local_1278._0_4_;
            auVar8._8_4_ = auVar6._8_4_ * fStack_1270;
            auVar8._12_4_ = auVar6._12_4_ * fStack_126c;
            auVar8._16_4_ = auVar6._16_4_ * fStack_1268;
            auVar8._20_4_ = auVar6._20_4_ * fStack_1264;
            auVar8._24_4_ = auVar6._24_4_ * fStack_1260;
            auVar8._28_4_ = auVar6._28_4_;
            auVar6 = vmaxps_avx(auVar8,local_12f8);
            auVar5 = vmaxps_avx(auVar5,auVar6);
            auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar23),auVar88);
            auVar9._4_4_ = auVar6._4_4_ * (float)local_1298._4_4_;
            auVar9._0_4_ = auVar6._0_4_ * (float)local_1298._0_4_;
            auVar9._8_4_ = auVar6._8_4_ * fStack_1290;
            auVar9._12_4_ = auVar6._12_4_ * fStack_128c;
            auVar9._16_4_ = auVar6._16_4_ * fStack_1288;
            auVar9._20_4_ = auVar6._20_4_ * fStack_1284;
            auVar9._24_4_ = auVar6._24_4_ * fStack_1280;
            auVar9._28_4_ = auVar6._28_4_;
            auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar24),auVar13);
            auVar10._4_4_ = auVar6._4_4_ * (float)local_12b8._4_4_;
            auVar10._0_4_ = auVar6._0_4_ * (float)local_12b8._0_4_;
            auVar10._8_4_ = auVar6._8_4_ * fStack_12b0;
            auVar10._12_4_ = auVar6._12_4_ * fStack_12ac;
            auVar10._16_4_ = auVar6._16_4_ * fStack_12a8;
            auVar10._20_4_ = auVar6._20_4_ * fStack_12a4;
            auVar10._24_4_ = auVar6._24_4_ * fStack_12a0;
            auVar10._28_4_ = auVar6._28_4_;
            auVar6 = vminps_avx(auVar9,auVar10);
            auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + local_14e0),auVar12);
            auVar11._4_4_ = auVar7._4_4_ * (float)local_12d8._4_4_;
            auVar11._0_4_ = auVar7._0_4_ * (float)local_12d8._0_4_;
            auVar11._8_4_ = auVar7._8_4_ * fStack_12d0;
            auVar11._12_4_ = auVar7._12_4_ * fStack_12cc;
            auVar11._16_4_ = auVar7._16_4_ * fStack_12c8;
            auVar11._20_4_ = auVar7._20_4_ * fStack_12c4;
            auVar11._24_4_ = auVar7._24_4_ * fStack_12c0;
            auVar11._28_4_ = auVar7._28_4_;
            auVar7 = vminps_avx(auVar11,local_1318);
            auVar6 = vminps_avx(auVar6,auVar7);
            auVar5 = vcmpps_avx(auVar5,auVar6,2);
            uVar22 = vmovmskps_avx(auVar5);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar22);
          }
          if ((uVar19 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar20 = 4;
            }
            else {
              uVar18 = uVar19 & 0xfffffffffffffff0;
              lVar17 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              iVar20 = 0;
              uVar19 = *(ulong *)(uVar18 + lVar17 * 8);
              uVar21 = unaff_R12 - 1 & unaff_R12;
              if (uVar21 != 0) {
                local_1510->ptr = uVar19;
                lVar17 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                uVar16 = uVar21 - 1;
                while( true ) {
                  local_1510 = local_1510 + 1;
                  uVar19 = *(ulong *)(uVar18 + lVar17 * 8);
                  uVar16 = uVar16 & uVar21;
                  if (uVar16 == 0) break;
                  local_1510->ptr = uVar19;
                  lVar17 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                    }
                  }
                  uVar21 = uVar16 - 1;
                }
              }
            }
          }
          else {
            iVar20 = 6;
          }
        } while (iVar20 == 0);
        uVar18 = uVar24;
        if (iVar20 == 6) {
          iVar20 = 0;
          uVar21 = (ulong)((uint)uVar19 & 0xf) - 8;
          bVar25 = uVar21 != 0;
          if (bVar25) {
            uVar19 = uVar19 & 0xfffffffffffffff0;
            local_14e8 = 0;
            do {
              lVar17 = local_14e8 * 0xb0;
              uVar22 = *(undefined4 *)&(ray->org).field_0;
              auVar31._4_4_ = uVar22;
              auVar31._0_4_ = uVar22;
              auVar31._8_4_ = uVar22;
              auVar31._12_4_ = uVar22;
              uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar41._4_4_ = uVar22;
              auVar41._0_4_ = uVar22;
              auVar41._8_4_ = uVar22;
              auVar41._12_4_ = uVar22;
              uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar48._4_4_ = uVar22;
              auVar48._0_4_ = uVar22;
              auVar48._8_4_ = uVar22;
              auVar48._12_4_ = uVar22;
              local_14f8 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + lVar17),auVar31);
              auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x10 + lVar17),auVar41);
              auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x20 + lVar17),auVar48);
              auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x30 + lVar17),auVar31);
              auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x40 + lVar17),auVar41);
              auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x50 + lVar17),auVar48);
              auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x60 + lVar17),auVar31);
              auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x70 + lVar17),auVar41);
              auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x80 + lVar17),auVar48);
              auVar31 = vsubps_avx(auVar68,local_14f8);
              auVar33 = vsubps_avx(auVar69,auVar57);
              auVar32 = vsubps_avx(auVar26,auVar81);
              fVar120 = auVar57._0_4_;
              fVar30 = fVar120 + auVar69._0_4_;
              fVar123 = auVar57._4_4_;
              fVar38 = fVar123 + auVar69._4_4_;
              fVar125 = auVar57._8_4_;
              fVar39 = fVar125 + auVar69._8_4_;
              fVar127 = auVar57._12_4_;
              fVar40 = fVar127 + auVar69._12_4_;
              fVar106 = auVar81._0_4_;
              fVar56 = fVar106 + auVar26._0_4_;
              fVar107 = auVar81._4_4_;
              fVar62 = fVar107 + auVar26._4_4_;
              fVar108 = auVar81._8_4_;
              fVar63 = fVar108 + auVar26._8_4_;
              fVar109 = auVar81._12_4_;
              fVar65 = fVar109 + auVar26._12_4_;
              fVar47 = auVar32._0_4_;
              auVar96._0_4_ = fVar30 * fVar47;
              fVar54 = auVar32._4_4_;
              auVar96._4_4_ = fVar38 * fVar54;
              fVar55 = auVar32._8_4_;
              auVar96._8_4_ = fVar39 * fVar55;
              fVar4 = auVar32._12_4_;
              auVar96._12_4_ = fVar40 * fVar4;
              fVar129 = auVar33._0_4_;
              auVar104._0_4_ = fVar129 * fVar56;
              fVar132 = auVar33._4_4_;
              auVar104._4_4_ = fVar132 * fVar62;
              fVar135 = auVar33._8_4_;
              auVar104._8_4_ = fVar135 * fVar63;
              fVar138 = auVar33._12_4_;
              auVar104._12_4_ = fVar138 * fVar65;
              auVar33 = vsubps_avx(auVar104,auVar96);
              fVar83 = local_14f8._0_4_;
              fVar95 = fVar83 + auVar68._0_4_;
              fVar89 = local_14f8._4_4_;
              fVar101 = fVar89 + auVar68._4_4_;
              fVar91 = local_14f8._8_4_;
              fVar102 = fVar91 + auVar68._8_4_;
              fVar93 = local_14f8._12_4_;
              fVar103 = fVar93 + auVar68._12_4_;
              fVar115 = auVar31._0_4_;
              auVar59._0_4_ = fVar115 * fVar56;
              fVar117 = auVar31._4_4_;
              auVar59._4_4_ = fVar117 * fVar62;
              fVar118 = auVar31._8_4_;
              auVar59._8_4_ = fVar118 * fVar63;
              fVar119 = auVar31._12_4_;
              auVar59._12_4_ = fVar119 * fVar65;
              auVar105._0_4_ = fVar95 * fVar47;
              auVar105._4_4_ = fVar101 * fVar54;
              auVar105._8_4_ = fVar102 * fVar55;
              auVar105._12_4_ = fVar103 * fVar4;
              auVar31 = vsubps_avx(auVar105,auVar59);
              auVar97._0_4_ = fVar95 * fVar129;
              auVar97._4_4_ = fVar101 * fVar132;
              auVar97._8_4_ = fVar102 * fVar135;
              auVar97._12_4_ = fVar103 * fVar138;
              auVar32._0_4_ = fVar115 * fVar30;
              auVar32._4_4_ = fVar117 * fVar38;
              auVar32._8_4_ = fVar118 * fVar39;
              auVar32._12_4_ = fVar119 * fVar40;
              auVar32 = vsubps_avx(auVar32,auVar97);
              fVar30 = (ray->dir).field_0.m128[2];
              local_1538._4_4_ = (ray->dir).field_0.m128[1];
              fVar38 = (ray->dir).field_0.m128[0];
              local_1548._4_4_ = fVar38;
              local_1548._0_4_ = fVar38;
              local_1548._8_4_ = fVar38;
              local_1548._12_4_ = fVar38;
              local_1558._0_4_ =
                   fVar38 * auVar33._0_4_ +
                   fVar30 * auVar32._0_4_ + local_1538._4_4_ * auVar31._0_4_;
              local_1558._4_4_ =
                   fVar38 * auVar33._4_4_ +
                   fVar30 * auVar32._4_4_ + local_1538._4_4_ * auVar31._4_4_;
              local_1558._8_4_ =
                   fVar38 * auVar33._8_4_ +
                   fVar30 * auVar32._8_4_ + local_1538._4_4_ * auVar31._8_4_;
              local_1558._12_4_ =
                   fVar38 * auVar33._12_4_ +
                   fVar30 * auVar32._12_4_ + local_1538._4_4_ * auVar31._12_4_;
              auVar57 = vsubps_avx(auVar57,auVar67);
              auVar81 = vsubps_avx(auVar81,auVar58);
              fVar63 = fVar120 + auVar67._0_4_;
              fVar65 = fVar123 + auVar67._4_4_;
              fVar95 = fVar125 + auVar67._8_4_;
              fVar101 = fVar127 + auVar67._12_4_;
              fVar102 = fVar106 + auVar58._0_4_;
              fVar103 = fVar107 + auVar58._4_4_;
              fVar64 = fVar108 + auVar58._8_4_;
              fVar66 = fVar109 + auVar58._12_4_;
              fVar39 = auVar81._0_4_;
              auVar111._0_4_ = fVar63 * fVar39;
              fVar40 = auVar81._4_4_;
              auVar111._4_4_ = fVar65 * fVar40;
              fVar56 = auVar81._8_4_;
              auVar111._8_4_ = fVar95 * fVar56;
              fVar62 = auVar81._12_4_;
              auVar111._12_4_ = fVar101 * fVar62;
              fVar130 = auVar57._0_4_;
              auVar122._0_4_ = fVar130 * fVar102;
              fVar133 = auVar57._4_4_;
              auVar122._4_4_ = fVar133 * fVar103;
              fVar136 = auVar57._8_4_;
              auVar122._8_4_ = fVar136 * fVar64;
              fVar139 = auVar57._12_4_;
              auVar122._12_4_ = fVar139 * fVar66;
              auVar57 = vsubps_avx(auVar122,auVar111);
              auVar81 = vsubps_avx(local_14f8,auVar82);
              fVar121 = auVar81._0_4_;
              auVar60._0_4_ = fVar121 * fVar102;
              fVar124 = auVar81._4_4_;
              auVar60._4_4_ = fVar124 * fVar103;
              fVar126 = auVar81._8_4_;
              auVar60._8_4_ = fVar126 * fVar64;
              fVar128 = auVar81._12_4_;
              auVar60._12_4_ = fVar128 * fVar66;
              fVar102 = fVar83 + auVar82._0_4_;
              fVar103 = fVar89 + auVar82._4_4_;
              fVar64 = fVar91 + auVar82._8_4_;
              fVar66 = fVar93 + auVar82._12_4_;
              auVar98._0_4_ = fVar102 * fVar39;
              auVar98._4_4_ = fVar103 * fVar40;
              auVar98._8_4_ = fVar64 * fVar56;
              auVar98._12_4_ = fVar66 * fVar62;
              auVar81 = vsubps_avx(auVar98,auVar60);
              auVar99._8_4_ = 0x7fffffff;
              auVar99._0_8_ = 0x7fffffff7fffffff;
              auVar99._12_4_ = 0x7fffffff;
              auVar85._0_4_ = fVar130 * fVar102;
              auVar85._4_4_ = fVar133 * fVar103;
              auVar85._8_4_ = fVar136 * fVar64;
              auVar85._12_4_ = fVar139 * fVar66;
              auVar33._0_4_ = fVar121 * fVar63;
              auVar33._4_4_ = fVar124 * fVar65;
              auVar33._8_4_ = fVar126 * fVar95;
              auVar33._12_4_ = fVar128 * fVar101;
              auVar31 = vsubps_avx(auVar33,auVar85);
              auVar61._0_4_ =
                   fVar38 * auVar57._0_4_ +
                   fVar30 * auVar31._0_4_ + local_1538._4_4_ * auVar81._0_4_;
              auVar61._4_4_ =
                   fVar38 * auVar57._4_4_ +
                   fVar30 * auVar31._4_4_ + local_1538._4_4_ * auVar81._4_4_;
              auVar61._8_4_ =
                   fVar38 * auVar57._8_4_ +
                   fVar30 * auVar31._8_4_ + local_1538._4_4_ * auVar81._8_4_;
              auVar61._12_4_ =
                   fVar38 * auVar57._12_4_ +
                   fVar30 * auVar31._12_4_ + local_1538._4_4_ * auVar81._12_4_;
              auVar57 = vsubps_avx(auVar82,auVar68);
              fVar84 = auVar82._0_4_ + auVar68._0_4_;
              fVar90 = auVar82._4_4_ + auVar68._4_4_;
              fVar92 = auVar82._8_4_ + auVar68._8_4_;
              fVar94 = auVar82._12_4_ + auVar68._12_4_;
              auVar81 = vsubps_avx(auVar67,auVar69);
              fVar63 = auVar67._0_4_ + auVar69._0_4_;
              fVar65 = auVar67._4_4_ + auVar69._4_4_;
              fVar95 = auVar67._8_4_ + auVar69._8_4_;
              fVar101 = auVar67._12_4_ + auVar69._12_4_;
              auVar82 = vsubps_avx(auVar58,auVar26);
              fVar103 = auVar58._0_4_ + auVar26._0_4_;
              fVar64 = auVar58._4_4_ + auVar26._4_4_;
              fVar66 = auVar58._8_4_ + auVar26._8_4_;
              fVar46 = auVar58._12_4_ + auVar26._12_4_;
              fVar131 = auVar82._0_4_;
              auVar49._0_4_ = fVar131 * fVar63;
              fVar134 = auVar82._4_4_;
              auVar49._4_4_ = fVar134 * fVar65;
              fVar137 = auVar82._8_4_;
              auVar49._8_4_ = fVar137 * fVar95;
              fVar140 = auVar82._12_4_;
              auVar49._12_4_ = fVar140 * fVar101;
              fVar110 = auVar81._0_4_;
              auVar70._0_4_ = fVar110 * fVar103;
              fVar112 = auVar81._4_4_;
              auVar70._4_4_ = fVar112 * fVar64;
              fVar113 = auVar81._8_4_;
              auVar70._8_4_ = fVar113 * fVar66;
              fVar114 = auVar81._12_4_;
              auVar70._12_4_ = fVar114 * fVar46;
              auVar81 = vsubps_avx(auVar70,auVar49);
              fVar102 = auVar57._0_4_;
              auVar42._0_4_ = fVar102 * fVar103;
              fVar103 = auVar57._4_4_;
              auVar42._4_4_ = fVar103 * fVar64;
              fVar64 = auVar57._8_4_;
              auVar42._8_4_ = fVar64 * fVar66;
              fVar66 = auVar57._12_4_;
              auVar42._12_4_ = fVar66 * fVar46;
              auVar71._0_4_ = fVar131 * fVar84;
              auVar71._4_4_ = fVar134 * fVar90;
              auVar71._8_4_ = fVar137 * fVar92;
              auVar71._12_4_ = fVar140 * fVar94;
              auVar57 = vsubps_avx(auVar71,auVar42);
              auVar72._0_4_ = fVar110 * fVar84;
              auVar72._4_4_ = fVar112 * fVar90;
              auVar72._8_4_ = fVar113 * fVar92;
              auVar72._12_4_ = fVar114 * fVar94;
              auVar82._0_4_ = fVar102 * fVar63;
              auVar82._4_4_ = fVar103 * fVar65;
              auVar82._8_4_ = fVar64 * fVar95;
              auVar82._12_4_ = fVar66 * fVar101;
              auVar82 = vsubps_avx(auVar82,auVar72);
              local_1538._0_4_ = local_1538._4_4_;
              fStack_1530 = local_1538._4_4_;
              fStack_152c = local_1538._4_4_;
              auVar26._0_4_ =
                   fVar38 * auVar81._0_4_ +
                   fVar30 * auVar82._0_4_ + local_1538._4_4_ * auVar57._0_4_;
              auVar26._4_4_ =
                   fVar38 * auVar81._4_4_ +
                   fVar30 * auVar82._4_4_ + local_1538._4_4_ * auVar57._4_4_;
              auVar26._8_4_ =
                   fVar38 * auVar81._8_4_ +
                   fVar30 * auVar82._8_4_ + local_1538._4_4_ * auVar57._8_4_;
              auVar26._12_4_ =
                   fVar38 * auVar81._12_4_ +
                   fVar30 * auVar82._12_4_ + local_1538._4_4_ * auVar57._12_4_;
              auVar116._0_4_ = auVar26._0_4_ + (float)local_1558._0_4_ + auVar61._0_4_;
              auVar116._4_4_ = auVar26._4_4_ + local_1558._4_4_ + auVar61._4_4_;
              auVar116._8_4_ = auVar26._8_4_ + local_1558._8_4_ + auVar61._8_4_;
              auVar116._12_4_ = auVar26._12_4_ + local_1558._12_4_ + auVar61._12_4_;
              auVar57 = vminps_avx(local_1558,auVar61);
              auVar57 = vminps_avx(auVar57,auVar26);
              local_1568 = vandps_avx(auVar116,auVar99);
              auVar50._0_4_ = local_1568._0_4_ * 1.1920929e-07;
              auVar50._4_4_ = local_1568._4_4_ * 1.1920929e-07;
              auVar50._8_4_ = local_1568._8_4_ * 1.1920929e-07;
              auVar50._12_4_ = local_1568._12_4_ * 1.1920929e-07;
              uVar23 = CONCAT44(auVar50._4_4_,auVar50._0_4_);
              auVar73._0_8_ = uVar23 ^ 0x8000000080000000;
              auVar73._8_4_ = -auVar50._8_4_;
              auVar73._12_4_ = -auVar50._12_4_;
              auVar57 = vcmpps_avx(auVar57,auVar73,5);
              auVar81 = vmaxps_avx(local_1558,auVar61);
              auVar81 = vmaxps_avx(auVar81,auVar26);
              auVar81 = vcmpps_avx(auVar81,auVar50,2);
              auVar57 = vorps_avx(auVar57,auVar81);
              auVar81 = auVar15 & auVar57;
              if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar81[0xf] < '\0') {
                auVar27._0_4_ = fVar130 * fVar47;
                auVar27._4_4_ = fVar133 * fVar54;
                auVar27._8_4_ = fVar136 * fVar55;
                auVar27._12_4_ = fVar139 * fVar4;
                auVar43._0_4_ = fVar129 * fVar39;
                auVar43._4_4_ = fVar132 * fVar40;
                auVar43._8_4_ = fVar135 * fVar56;
                auVar43._12_4_ = fVar138 * fVar62;
                auVar67 = vsubps_avx(auVar43,auVar27);
                auVar51._0_4_ = fVar110 * fVar39;
                auVar51._4_4_ = fVar112 * fVar40;
                auVar51._8_4_ = fVar113 * fVar56;
                auVar51._12_4_ = fVar114 * fVar62;
                auVar74._0_4_ = fVar130 * fVar131;
                auVar74._4_4_ = fVar133 * fVar134;
                auVar74._8_4_ = fVar136 * fVar137;
                auVar74._12_4_ = fVar139 * fVar140;
                auVar58 = vsubps_avx(auVar74,auVar51);
                auVar81 = vandps_avx(auVar99,auVar27);
                auVar82 = vandps_avx(auVar99,auVar51);
                auVar81 = vcmpps_avx(auVar81,auVar82,1);
                local_1348 = vblendvps_avx(auVar58,auVar67,auVar81);
                auVar44._0_4_ = fVar121 * fVar131;
                auVar44._4_4_ = fVar124 * fVar134;
                auVar44._8_4_ = fVar126 * fVar137;
                auVar44._12_4_ = fVar128 * fVar140;
                auVar52._0_4_ = fVar121 * fVar47;
                auVar52._4_4_ = fVar124 * fVar54;
                auVar52._8_4_ = fVar126 * fVar55;
                auVar52._12_4_ = fVar128 * fVar4;
                auVar75._0_4_ = fVar39 * fVar115;
                auVar75._4_4_ = fVar40 * fVar117;
                auVar75._8_4_ = fVar56 * fVar118;
                auVar75._12_4_ = fVar62 * fVar119;
                auVar67 = vsubps_avx(auVar52,auVar75);
                auVar78._0_4_ = fVar39 * fVar102;
                auVar78._4_4_ = fVar40 * fVar103;
                auVar78._8_4_ = fVar56 * fVar64;
                auVar78._12_4_ = fVar62 * fVar66;
                auVar58 = vsubps_avx(auVar78,auVar44);
                auVar81 = vandps_avx(auVar99,auVar75);
                auVar82 = vandps_avx(auVar99,auVar44);
                auVar81 = vcmpps_avx(auVar81,auVar82,1);
                local_1338 = vblendvps_avx(auVar58,auVar67,auVar81);
                auVar34._0_4_ = fVar130 * fVar102;
                auVar34._4_4_ = fVar133 * fVar103;
                auVar34._8_4_ = fVar136 * fVar64;
                auVar34._12_4_ = fVar139 * fVar66;
                auVar53._0_4_ = fVar130 * fVar115;
                auVar53._4_4_ = fVar133 * fVar117;
                auVar53._8_4_ = fVar136 * fVar118;
                auVar53._12_4_ = fVar139 * fVar119;
                auVar76._0_4_ = fVar121 * fVar129;
                auVar76._4_4_ = fVar124 * fVar132;
                auVar76._8_4_ = fVar126 * fVar135;
                auVar76._12_4_ = fVar128 * fVar138;
                auVar79._0_4_ = fVar121 * fVar110;
                auVar79._4_4_ = fVar124 * fVar112;
                auVar79._8_4_ = fVar126 * fVar113;
                auVar79._12_4_ = fVar128 * fVar114;
                auVar67 = vsubps_avx(auVar53,auVar76);
                auVar58 = vsubps_avx(auVar79,auVar34);
                auVar81 = vandps_avx(auVar99,auVar76);
                auVar82 = vandps_avx(auVar99,auVar34);
                auVar81 = vcmpps_avx(auVar81,auVar82,1);
                local_1328 = vblendvps_avx(auVar58,auVar67,auVar81);
                fVar47 = local_1348._0_4_ * fVar38 +
                         fVar30 * local_1328._0_4_ + local_1338._0_4_ * local_1538._4_4_;
                fVar39 = local_1348._4_4_ * fVar38 +
                         fVar30 * local_1328._4_4_ + local_1338._4_4_ * local_1538._4_4_;
                fVar54 = local_1348._8_4_ * fVar38 +
                         fVar30 * local_1328._8_4_ + local_1338._8_4_ * local_1538._4_4_;
                fVar30 = local_1348._12_4_ * fVar38 +
                         fVar30 * local_1328._12_4_ + local_1338._12_4_ * local_1538._4_4_;
                auVar77._0_4_ = fVar47 + fVar47;
                auVar77._4_4_ = fVar39 + fVar39;
                auVar77._8_4_ = fVar54 + fVar54;
                auVar77._12_4_ = fVar30 + fVar30;
                fVar54 = local_1348._0_4_ * fVar83 +
                         local_1328._0_4_ * fVar106 + local_1338._0_4_ * fVar120;
                fVar40 = local_1348._4_4_ * fVar89 +
                         local_1328._4_4_ * fVar107 + local_1338._4_4_ * fVar123;
                fVar55 = local_1348._8_4_ * fVar91 +
                         local_1328._8_4_ * fVar108 + local_1338._8_4_ * fVar125;
                fVar56 = local_1348._12_4_ * fVar93 +
                         local_1328._12_4_ * fVar109 + local_1338._12_4_ * fVar127;
                auVar81 = vrcpps_avx(auVar77);
                fVar30 = auVar81._0_4_;
                auVar86._0_4_ = auVar77._0_4_ * fVar30;
                fVar38 = auVar81._4_4_;
                auVar86._4_4_ = auVar77._4_4_ * fVar38;
                fVar47 = auVar81._8_4_;
                auVar86._8_4_ = auVar77._8_4_ * fVar47;
                fVar39 = auVar81._12_4_;
                auVar86._12_4_ = auVar77._12_4_ * fVar39;
                auVar100._8_4_ = 0x3f800000;
                auVar100._0_8_ = &DAT_3f8000003f800000;
                auVar100._12_4_ = 0x3f800000;
                auVar81 = vsubps_avx(auVar100,auVar86);
                local_1358._0_4_ = (fVar54 + fVar54) * (fVar30 + fVar30 * auVar81._0_4_);
                local_1358._4_4_ = (fVar40 + fVar40) * (fVar38 + fVar38 * auVar81._4_4_);
                local_1358._8_4_ = (fVar55 + fVar55) * (fVar47 + fVar47 * auVar81._8_4_);
                local_1358._12_4_ = (fVar56 + fVar56) * (fVar39 + fVar39 * auVar81._12_4_);
                uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar80._4_4_ = uVar22;
                auVar80._0_4_ = uVar22;
                auVar80._8_4_ = uVar22;
                auVar80._12_4_ = uVar22;
                auVar81 = vcmpps_avx(auVar80,local_1358,2);
                fVar30 = ray->tfar;
                auVar87._4_4_ = fVar30;
                auVar87._0_4_ = fVar30;
                auVar87._8_4_ = fVar30;
                auVar87._12_4_ = fVar30;
                auVar82 = vcmpps_avx(local_1358,auVar87,2);
                auVar81 = vandps_avx(auVar81,auVar82);
                auVar82 = vcmpps_avx(auVar77,_DAT_01feba10,4);
                auVar81 = vandps_avx(auVar82,auVar81);
                auVar57 = vandps_avx(auVar57,auVar15);
                auVar81 = vpslld_avx(auVar81,0x1f);
                auVar82 = vpsrad_avx(auVar81,0x1f);
                auVar81 = auVar57 & auVar82;
                if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar81[0xf] < '\0') {
                  auVar57 = vandps_avx(auVar82,auVar57);
                  local_1538 = (long)context->scene;
                  auVar81 = vrcpps_avx(auVar116);
                  fVar30 = auVar81._0_4_;
                  auVar35._0_4_ = auVar116._0_4_ * fVar30;
                  fVar38 = auVar81._4_4_;
                  auVar35._4_4_ = auVar116._4_4_ * fVar38;
                  fVar47 = auVar81._8_4_;
                  auVar35._8_4_ = auVar116._8_4_ * fVar47;
                  fVar39 = auVar81._12_4_;
                  auVar35._12_4_ = auVar116._12_4_ * fVar39;
                  auVar45._8_4_ = 0x3f800000;
                  auVar45._0_8_ = &DAT_3f8000003f800000;
                  auVar45._12_4_ = 0x3f800000;
                  auVar81 = vsubps_avx(auVar45,auVar35);
                  auVar28._0_4_ = fVar30 + fVar30 * auVar81._0_4_;
                  auVar28._4_4_ = fVar38 + fVar38 * auVar81._4_4_;
                  auVar28._8_4_ = fVar47 + fVar47 * auVar81._8_4_;
                  auVar28._12_4_ = fVar39 + fVar39 * auVar81._12_4_;
                  auVar36._8_4_ = 0x219392ef;
                  auVar36._0_8_ = 0x219392ef219392ef;
                  auVar36._12_4_ = 0x219392ef;
                  auVar81 = vcmpps_avx(local_1568,auVar36,5);
                  auVar81 = vandps_avx(auVar81,auVar28);
                  auVar37._0_4_ = (float)local_1558._0_4_ * auVar81._0_4_;
                  auVar37._4_4_ = local_1558._4_4_ * auVar81._4_4_;
                  auVar37._8_4_ = local_1558._8_4_ * auVar81._8_4_;
                  auVar37._12_4_ = local_1558._12_4_ * auVar81._12_4_;
                  local_1378 = vminps_avx(auVar37,auVar45);
                  auVar29._0_4_ = auVar61._0_4_ * auVar81._0_4_;
                  auVar29._4_4_ = auVar61._4_4_ * auVar81._4_4_;
                  auVar29._8_4_ = auVar61._8_4_ * auVar81._8_4_;
                  auVar29._12_4_ = auVar61._12_4_ * auVar81._12_4_;
                  local_1368 = vminps_avx(auVar29,auVar45);
                  uVar22 = vmovmskps_avx(auVar57);
                  uVar24 = CONCAT44((int)(uVar24 >> 0x20),uVar22);
                  do {
                    uVar23 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    h.geomID = *(uint *)(lVar17 + uVar19 + 0x90 + uVar23 * 4);
                    lVar2 = *(long *)(*(long *)(local_1538 + 0x1e8) + (ulong)h.geomID * 8);
                    if ((*(uint *)(lVar2 + 0x34) & ray->mask) == 0) {
                      uVar24 = uVar24 ^ 1L << (uVar23 & 0x3f);
                      bVar14 = true;
                    }
                    else {
                      pRVar3 = context->args;
                      if ((pRVar3->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar2 + 0x48) == 0)) {
                        bVar14 = false;
                      }
                      else {
                        local_1548._0_8_ = uVar21;
                        h.u = *(float *)(local_1378 + uVar23 * 4);
                        h.v = *(float *)(local_1368 + uVar23 * 4);
                        args.context = context->user;
                        h.primID = *(uint *)(lVar17 + uVar19 + 0xa0 + uVar23 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1348 + uVar23 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_1338 + uVar23 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_1328 + uVar23 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_1558._0_4_ = ray->tfar;
                        ray->tfar = *(float *)(local_1358 + uVar23 * 4);
                        local_156c = -1;
                        args.valid = &local_156c;
                        args.geometryUserPtr = *(void **)(lVar2 + 0x18);
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (*(code **)(lVar2 + 0x48) == (code *)0x0) {
LAB_0030591e:
                          if (pRVar3->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar3->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               ((*(byte *)(lVar2 + 0x3e) & 0x40) != 0)) {
                              (*pRVar3->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_0030597a;
                          }
                          bVar14 = false;
                        }
                        else {
                          local_1568._0_8_ = context;
                          local_14f8._0_8_ = ray;
                          (**(code **)(lVar2 + 0x48))(&args);
                          context = (RayQueryContext *)local_1568._0_8_;
                          ray = (Ray *)local_14f8._0_8_;
                          if (*args.valid != 0) goto LAB_0030591e;
LAB_0030597a:
                          ray->tfar = (float)local_1558._0_4_;
                          uVar24 = uVar24 ^ 1L << (uVar23 & 0x3f);
                          bVar14 = true;
                        }
                        uVar21 = local_1548._0_8_;
                      }
                    }
                    iVar20 = 0;
                    if (!bVar14) {
                      uVar23 = local_1500;
                      uVar18 = local_1508;
                      if (bVar25) {
                        ray->tfar = -INFINITY;
                        iVar20 = 3;
                      }
                      goto LAB_003059e1;
                    }
                  } while (uVar24 != 0);
                  uVar24 = 0;
                }
              }
              iVar20 = 0;
              local_14e8 = local_14e8 + 1;
              bVar25 = local_14e8 < uVar21;
              uVar23 = local_1500;
              uVar18 = local_1508;
            } while (local_14e8 != uVar21);
          }
        }
LAB_003059e1:
        uVar24 = uVar18;
      } while (iVar20 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }